

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_ComboAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint MeleeDamage;
  int iVar1;
  bool bVar2;
  PClass *pPVar3;
  PClassActor *MissileType;
  AActor *self;
  char *__assertion;
  FSoundID local_30;
  FName local_2c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003d93cb;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (AActor *)0x0) {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d93cb;
        }
        goto LAB_003d9345;
      }
    }
    else if (self != (AActor *)0x0) goto LAB_003d93bb;
    self = (AActor *)0x0;
LAB_003d9345:
    pPVar3 = DObject::GetClass((DObject *)self);
    MeleeDamage = pPVar3[1].SpecialInits.Count;
    pPVar3 = DObject::GetClass((DObject *)self);
    iVar1 = *(int *)&pPVar3[1].ParentClass;
    pPVar3 = DObject::GetClass((DObject *)self);
    local_2c.Index = *(int *)((long)&pPVar3[1].ParentClass + 4);
    MissileType = PClass::FindActor(&local_2c);
    local_30.ID = iVar1;
    pPVar3 = DObject::GetClass((DObject *)self);
    DoAttack(self,true,true,MeleeDamage,&local_30,MissileType,(double)pPVar3[1].Pointers);
    return 0;
  }
LAB_003d93bb:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003d93cb:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x3d3,
                "int AF_AActor_A_ComboAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ComboAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	int MeleeDamage = self->GetClass()->MeleeDamage;
	FSoundID MeleeSound = self->GetClass()->MeleeSound;
	PClassActor *MissileType = PClass::FindActor(self->GetClass()->MissileName);
	DoAttack(self, true, true, MeleeDamage, MeleeSound, MissileType, self->GetClass()->MissileHeight);
	return 0;
}